

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STObject.cpp
# Opt level: O0

bool __thiscall jbcoin::STObject::operator==(STObject *this,STObject *obj)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  reference this_00;
  SField *f;
  reference pSVar4;
  STBase *pSVar5;
  SField *pSVar6;
  STVar *t2_1;
  const_iterator __end1_1;
  const_iterator __begin1_1;
  list_type *__range1_1;
  int fields;
  STVar *t2;
  const_iterator __end3;
  const_iterator __begin3;
  list_type *__range3;
  bool match;
  STVar *t1;
  const_iterator __end1;
  const_iterator __begin1;
  list_type *__range1;
  int matches;
  STObject *obj_local;
  STObject *this_local;
  
  __range1._4_4_ = 0;
  __end1 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                     (&this->v_);
  t1 = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::end
                          (&this->v_);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                *)&t1);
    if (!bVar1) {
      __range1_1._4_4_ = 0;
      __end1_1 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                           (&obj->v_);
      t2_1 = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
                      end(&obj->v_);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end1_1,
                                (__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                 *)&t2_1), bVar1) {
        pSVar4 = __gnu_cxx::
                 __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                 ::operator*(&__end1_1);
        pSVar5 = jbcoin::detail::STVar::operator->(pSVar4);
        iVar3 = (*pSVar5->_vptr_STBase[4])();
        if (iVar3 != 0) {
          pSVar5 = jbcoin::detail::STVar::operator->(pSVar4);
          pSVar6 = STBase::getFName(pSVar5);
          bVar1 = SField::isBinary(pSVar6);
          if (bVar1) {
            __range1_1._4_4_ = __range1_1._4_4_ + 1;
          }
        }
        __gnu_cxx::
        __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
        ::operator++(&__end1_1);
      }
      return __range1_1._4_4_ == __range1._4_4_;
    }
    pSVar4 = __gnu_cxx::
             __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
             ::operator*(&__end1);
    pSVar5 = jbcoin::detail::STVar::operator->(pSVar4);
    iVar3 = (*pSVar5->_vptr_STBase[4])();
    if (iVar3 != 0) {
      pSVar5 = jbcoin::detail::STVar::operator->(pSVar4);
      pSVar6 = STBase::getFName(pSVar5);
      bVar1 = SField::isBinary(pSVar6);
      if (bVar1) {
        bVar1 = false;
        __end3 = std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::begin
                           (&obj->v_);
        t2 = (STVar *)std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>::
                      end(&obj->v_);
        while (bVar2 = __gnu_cxx::operator!=
                                 (&__end3,(__normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                                           *)&t2), bVar2) {
          this_00 = __gnu_cxx::
                    __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
                    ::operator*(&__end3);
          pSVar5 = jbcoin::detail::STVar::operator->(pSVar4);
          pSVar6 = STBase::getFName(pSVar5);
          pSVar5 = jbcoin::detail::STVar::operator->(this_00);
          f = STBase::getFName(pSVar5);
          bVar2 = SField::operator==(pSVar6,f);
          if (bVar2) {
            bVar1 = jbcoin::detail::operator!=(this_00,pSVar4);
            if (bVar1) {
              return false;
            }
            bVar1 = true;
            __range1._4_4_ = __range1._4_4_ + 1;
            break;
          }
          __gnu_cxx::
          __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
          ::operator++(&__end3);
        }
        if (!bVar1) {
          return false;
        }
      }
    }
    __gnu_cxx::
    __normal_iterator<const_jbcoin::detail::STVar_*,_std::vector<jbcoin::detail::STVar,_std::allocator<jbcoin::detail::STVar>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

bool STObject::operator== (const STObject& obj) const
{
    // This is not particularly efficient, and only compares data elements
    // with binary representations
    int matches = 0;
    for (auto const& t1 : v_)
    {
        if ((t1->getSType () != STI_NOTPRESENT) && t1->getFName ().isBinary ())
        {
            // each present field must have a matching field
            bool match = false;
            for (auto const& t2 : obj.v_)
            {
                if (t1->getFName () == t2->getFName ())
                {
                    if (t2 != t1)
                        return false;

                    match = true;
                    ++matches;
                    break;
                }
            }

            if (!match)
                return false;
        }
    }

    int fields = 0;
    for (auto const& t2 : obj.v_)
    {
        if ((t2->getSType () != STI_NOTPRESENT) && t2->getFName ().isBinary ())
            ++fields;
    }

    if (fields != matches)
        return false;

    return true;
}